

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

uint16_t __thiscall double_conversion::Bignum::DivideModuloIntBignum(Bignum *this,Bignum *other)

{
  short sVar1;
  uint factor;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint factor_00;
  uint16_t uVar5;
  int iVar6;
  
  if ((int)this->exponent_ + (int)this->used_bigits_ <
      (int)other->exponent_ + (int)other->used_bigits_) {
    uVar5 = 0;
  }
  else {
    Align(this,other);
    iVar6 = 0;
    while( true ) {
      iVar4 = (int)this->used_bigits_;
      sVar1 = other->used_bigits_;
      factor = this->bigits_buffer_[(long)iVar4 + -1];
      if (iVar4 + this->exponent_ <= (int)other->exponent_ + (int)sVar1) break;
      iVar6 = iVar6 + factor;
      SubtractTimes(this,other,factor);
    }
    uVar2 = other->bigits_buffer_[(long)(int)sVar1 + -1];
    if (sVar1 == 1) {
      this->bigits_buffer_[(long)iVar4 + -1] = factor % uVar2;
      uVar5 = (short)iVar6 + (short)(factor / uVar2);
      Clamp(this);
    }
    else {
      factor_00 = factor / (uVar2 + 1);
      iVar6 = iVar6 + factor_00;
      uVar5 = (uint16_t)iVar6;
      SubtractTimes(this,other,factor_00);
      if ((factor_00 + 1) * uVar2 <= factor) {
        while( true ) {
          uVar5 = (uint16_t)iVar6;
          bVar3 = LessEqual(other,this);
          if (!bVar3) break;
          SubtractBignum(this,other);
          iVar6 = iVar6 + 1;
        }
      }
    }
  }
  return uVar5;
}

Assistant:

void Bignum::AssignHexString(Vector<const char> value) {
  Zero();
  // Required capacity could be reduced by ignoring leading zeros.
  EnsureCapacity(((value.length() * 4) + kBigitSize - 1) / kBigitSize);
  DOUBLE_CONVERSION_ASSERT(sizeof(uint64_t) * 8 >= kBigitSize + 4);  // TODO: static_assert
  // Accumulates converted hex digits until at least kBigitSize bits.
  // Works with non-factor-of-four kBigitSizes.
  uint64_t tmp = 0;  // Accumulates converted hex digits until at least
  for (int cnt = 0; !value.is_empty(); value.pop_back()) {
    tmp |= (HexCharValue(value.last()) << cnt);
    if ((cnt += 4) >= kBigitSize) {
      RawBigit(used_bigits_++) = (tmp & kBigitMask);
      cnt -= kBigitSize;
      tmp >>= kBigitSize;
    }
  }
  if (tmp > 0) {
    RawBigit(used_bigits_++) = tmp;
  }
  Clamp();
}